

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O2

uint __thiscall dg::pta::PSNoopRemover::run(PSNoopRemover *this)

{
  undefined8 *puVar1;
  PSNode *nd_00;
  uint uVar2;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *nd;
  undefined8 *puVar3;
  
  puVar1 = *(undefined8 **)(*(long *)this + 0x18);
  uVar2 = 0;
  for (puVar3 = *(undefined8 **)(*(long *)this + 0x10); puVar3 != puVar1; puVar3 = puVar3 + 1) {
    nd_00 = (PSNode *)*puVar3;
    if ((nd_00 != (PSNode *)0x0) && (nd_00->type == NOOP)) {
      removeNode(*(PointerGraph **)this,nd_00);
      uVar2 = uVar2 + 1;
    }
  }
  return uVar2;
}

Assistant:

unsigned PSNoopRemover::run() {
    unsigned removed = 0;
    for (const auto &nd : G->getNodes()) {
        if (!nd)
            continue;

        if (nd->getType() == PSNodeType::NOOP) {
            // this should not break the iterator
            removeNode(G, nd.get());
            ++removed;
        }
    }
    return removed;
}